

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t archive_read_format_zip_streamable_bid(archive_read *a,wchar_t best_bid)

{
  byte bVar1;
  char *pcVar2;
  
  pcVar2 = (char *)__archive_read_ahead(a,4,(ssize_t *)0x0);
  if (pcVar2 == (char *)0x0) {
    return L'\xffffffff';
  }
  if (*pcVar2 != 'P') {
    return L'\0';
  }
  if (pcVar2[1] != 'K') {
    return L'\0';
  }
  bVar1 = pcVar2[2];
  switch(bVar1) {
  case 1:
    if (pcVar2[3] == '\x02') {
      return L'\x1d';
    }
    switch(bVar1) {
    case 3:
      goto switchD_001407a8_caseD_3;
    case 4:
      goto LAB_00140840;
    case 5:
      goto switchD_001407a8_caseD_5;
    case 6:
      goto switchD_001407a8_caseD_6;
    case 7:
      goto switchD_001407a8_caseD_7;
    }
    break;
  case 2:
  case 4:
    goto LAB_00140840;
  case 3:
switchD_001407a8_caseD_3:
    if (pcVar2[3] == '\x04') {
      return L'\x1d';
    }
    if (bVar1 < 7) {
      if (bVar1 == 5) goto switchD_001407a8_caseD_5;
LAB_001407fb:
      if (bVar1 != 6) {
        return L'\0';
      }
      goto switchD_001407a8_caseD_6;
    }
    if (bVar1 == 7) goto switchD_001407a8_caseD_7;
    break;
  case 5:
switchD_001407a8_caseD_5:
    if (pcVar2[3] == '\x06') {
      return L'\x1d';
    }
    if (bVar1 == 0x30) goto LAB_00140833;
    if (bVar1 != 7) goto LAB_001407fb;
  case 7:
switchD_001407a8_caseD_7:
    if (pcVar2[3] == '\b') {
      return L'\x1d';
    }
    break;
  case 6:
switchD_001407a8_caseD_6:
    if (pcVar2[3] == '\x06') {
      return L'\x1d';
    }
    if (bVar1 != 0x30) {
      if (bVar1 != 7) {
        return L'\0';
      }
      goto switchD_001407a8_caseD_7;
    }
    goto LAB_00140833;
  }
  if (bVar1 == 0x30) {
LAB_00140833:
    if (pcVar2[3] == '0') {
      return L'\x1d';
    }
  }
LAB_00140840:
  return L'\0';
}

Assistant:

static int
archive_read_format_zip_streamable_bid(struct archive_read *a, int best_bid)
{
	const char *p;

	(void)best_bid; /* UNUSED */

	if ((p = __archive_read_ahead(a, 4, NULL)) == NULL)
		return (-1);

	/*
	 * Bid of 29 here comes from:
	 *  + 16 bits for "PK",
	 *  + next 16-bit field has 6 options so contributes
	 *    about 16 - log_2(6) ~= 16 - 2.6 ~= 13 bits
	 *
	 * So we've effectively verified ~29 total bits of check data.
	 */
	if (p[0] == 'P' && p[1] == 'K') {
		if ((p[2] == '\001' && p[3] == '\002')
		    || (p[2] == '\003' && p[3] == '\004')
		    || (p[2] == '\005' && p[3] == '\006')
		    || (p[2] == '\006' && p[3] == '\006')
		    || (p[2] == '\007' && p[3] == '\010')
		    || (p[2] == '0' && p[3] == '0'))
			return (29);
	}

	/* TODO: It's worth looking ahead a little bit for a valid
	 * PK signature.  In particular, that would make it possible
	 * to read some UUEncoded SFX files or SFX files coming from
	 * a network socket. */

	return (0);
}